

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_pipeline.hpp
# Opt level: O2

void __thiscall
tf::
DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:1552:59)>_>
::_on_pipe(DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
           *this,Pipeflow *pf,Runtime *param_2)

{
  size_t sVar1;
  size_t *psVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  code *pcVar4;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>,_monostate>_> *__str;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  int iVar5;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>,_monostate>_> *pvVar6;
  Enum EVar7;
  variant<int,std::__cxx11::string,std::monostate> *this_00;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  Result local_f0;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>,_monostate>_> local_cc;
  ResultBuilder DOCTEST_RB;
  Expression_lhs<const_unsigned_long_&> local_50;
  size_t local_40;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>,_monostate>_> *local_38;
  
  EVar7 = DT_REQUIRE;
  switch(pf->_pipe) {
  case 0:
    psVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
             .
             super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
             ._M_head_impl._callable.j1_1;
    sVar1 = *psVar2;
    if (sVar1 == (this->_pipes).
                 super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                 .
                 super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
                 ._M_head_impl._callable.N) {
      Pipeflow::stop(pf);
      iVar5 = 0;
    }
    else {
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x5f7;
      DOCTEST_RB.super_AssertData.m_expr = "j1_1 == source[j1_1]";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      DOCTEST_RB.super_AssertData.m_at = EVar7;
      local_50.lhs = psVar2;
      local_50.m_at = EVar7;
      doctest::detail::Expression_lhs<const_unsigned_long_&>::operator==<int,_nullptr>
                (&local_f0,&local_50,
                 (((this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
                   ._M_head_impl._callable.source)->super__Vector_base<int,_std::allocator<int>_>).
                 _M_impl.super__Vector_impl_data._M_start + sVar1);
      doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
      doctest::String::~String(&local_f0.m_decomp);
      doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_08);
      if (extraout_AL_08 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      doctest::detail::ResultBuilder::react(&DOCTEST_RB);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x5f8;
      DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_50.lhs = (unsigned_long *)
                     (pf->_token %
                     (this->_pipes).
                     super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                     .
                     super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
                     ._M_head_impl._callable.L);
      local_40 = pf->_line;
      DOCTEST_RB.super_AssertData.m_at = EVar7;
      local_50.m_at = EVar7;
      doctest::detail::Expression_lhs<unsigned_long_const>::operator==
                (&local_f0,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
      doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
      doctest::String::~String(&local_f0.m_decomp);
      doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_09);
      if (extraout_AL_09 != '\0') {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
      doctest::detail::ResultBuilder::react(&DOCTEST_RB);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      pvVar3 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
               ._M_head_impl._callable.source;
      psVar2 = (this->_pipes).
               super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
               .
               super__Head_base<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_false>
               ._M_head_impl._callable.j1_1;
      sVar1 = *psVar2;
      *psVar2 = sVar1 + 1;
      iVar5 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar1] + 1;
    }
    DOCTEST_RB.super_AssertData.m_test_case =
         (TestCaseData *)CONCAT44(DOCTEST_RB.super_AssertData.m_test_case._4_4_,iVar5);
    this_00 = (variant<int,std::__cxx11::string,std::monostate> *)
              ((this->_buffer).
               super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pf->_line);
    goto LAB_00133291;
  case 1:
    pvVar6 = std::get<0ul,int,std::__cxx11::string,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_cc = *pvVar6;
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x5ff;
    DOCTEST_RB.super_AssertData.m_expr = "j1_2 < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                   ._M_head_impl._callable.j1_2;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_f0,&local_50,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                ._M_head_impl._callable.N);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_05);
    if (extraout_AL_05 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x600;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   (pf->_token %
                   (this->_pipes).
                   super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                   .
                   super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                   ._M_head_impl._callable.L);
    local_40 = pf->_line;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_f0,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_06);
    if (extraout_AL_06 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x601;
    DOCTEST_RB.super_AssertData.m_expr = "source[j1_2] + 1 == input";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   ((ulong)((((this->_pipes).
                              super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                              ._M_head_impl._callable.source)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [*(this->_pipes).
                              super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                              .
                              super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
                              ._M_head_impl._callable.j1_2] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_f0,(Expression_lhs<const_int> *)&local_50,&local_cc);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_07);
    if (extraout_AL_07 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    psVar2 = (this->_pipes).
             super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
             .
             super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
             .
             super__Head_base<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_false>
             ._M_head_impl._callable.j1_2;
    *psVar2 = *psVar2 + 1;
    std::__cxx11::to_string((string *)&DOCTEST_RB,local_cc);
    std::variant<int,std::__cxx11::string,std::monostate>::operator=
              ((variant<int,std::__cxx11::string,std::monostate> *)
               ((this->_buffer).
                super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + pf->_line),(string *)&DOCTEST_RB);
    std::__cxx11::string::~string((string *)&DOCTEST_RB);
    break;
  case 2:
    local_38 = std::get<1ul,int,std::__cxx11::string,std::monostate>
                         (&(this->_buffer).
                           super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x608;
    DOCTEST_RB.super_AssertData.m_expr = "j1_3 < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                            ._M_head_impl._callable + 0x10);
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_f0,&local_50,
               &(this->_pipes).
                super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                .
                super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                ._M_head_impl._callable.N);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
    if (extraout_AL != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x609;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                            ._M_head_impl._callable + 0x18));
    local_40 = pf->_line;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_f0,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_00);
    if (extraout_AL_00 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    __str = local_38;
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x60a;
    DOCTEST_RB.super_AssertData.m_expr = "source[j1_3] + 1 == stoi(input)";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                                       ._M_head_impl._callable + 8))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                                       ._M_head_impl._callable + 0x10)] + 1) | 0xc00000000);
    iVar5 = std::__cxx11::stoi(local_38,(size_t *)0x0,10);
    local_40 = CONCAT44(local_40._4_4_,iVar5);
    doctest::detail::Expression_lhs<int_const>::operator==
              (&local_f0,(Expression_lhs<int_const> *)&local_50,(int *)&local_40);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_01);
    if (extraout_AL_01 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    psVar2 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Head_base<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_false>
                      ._M_head_impl._callable + 0x10);
    *psVar2 = *psVar2 + 1;
    iVar5 = std::__cxx11::stoi(__str,(size_t *)0x0,10);
    DOCTEST_RB.super_AssertData.m_test_case =
         (TestCaseData *)CONCAT44(DOCTEST_RB.super_AssertData.m_test_case._4_4_,iVar5);
    this_00 = (variant<int,std::__cxx11::string,std::monostate> *)
              ((this->_buffer).
               super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + pf->_line);
LAB_00133291:
    std::variant<int,std::__cxx11::string,std::monostate>::operator=(this_00,(int *)&DOCTEST_RB);
    break;
  case 3:
    pvVar6 = std::get<0ul,int,std::__cxx11::string,std::monostate>
                       (&(this->_buffer).
                         super__Vector_base<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>,_std::allocator<tf::CachelineAligned<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::monostate>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[pf->_line].data);
    local_cc = *pvVar6;
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x611;
    DOCTEST_RB.super_AssertData.m_expr = "j1_4 < N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = *(size_t **)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                            ._M_head_impl + 0x18);
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<const_unsigned_long_&>::operator<<unsigned_long,_nullptr>
              (&local_f0,&local_50,
               (unsigned_long *)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                       .
                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                       ._M_head_impl + 8));
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_02);
    if (extraout_AL_02 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x612;
    DOCTEST_RB.super_AssertData.m_expr = "pf.token() % L == pf.line()";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   (pf->_token %
                   *(size_t *)
                    ((long)&(this->_pipes).
                            super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                            .
                            super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                            ._M_head_impl + 0x20));
    local_40 = pf->_line;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    local_50.m_at = EVar7;
    doctest::detail::Expression_lhs<unsigned_long_const>::operator==
              (&local_f0,(Expression_lhs<unsigned_long_const> *)&local_50,&local_40);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_03);
    if (extraout_AL_03 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x613;
    DOCTEST_RB.super_AssertData.m_expr = "source[j1_4] + 1 == input";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_50.lhs = (unsigned_long *)
                   ((ulong)(((*(vector<int,_std::allocator<int>_> **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                                       ._M_head_impl + 0x10))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start
                            [**(size_t **)
                               ((long)&(this->_pipes).
                                       super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                                       .
                                       super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                                       ._M_head_impl + 0x18)] + 1) | 0xc00000000);
    doctest::detail::Expression_lhs<const_int>::operator==<int,_nullptr>
              (&local_f0,(Expression_lhs<const_int> *)&local_50,&local_cc);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
    doctest::String::~String(&local_f0.m_decomp);
    doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x_04);
    if (extraout_AL_04 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    psVar2 = *(size_t **)
              ((long)&(this->_pipes).
                      super__Tuple_impl<0UL,_tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1522:68)>,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<1UL,_tf::DataPipe<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1534:66)>,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<2UL,_tf::DataPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1543:66)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Tuple_impl<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>_>
                      .
                      super__Head_base<3UL,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:1552:59)>,_false>
                      ._M_head_impl + 0x18);
    *psVar2 = *psVar2 + 1;
  }
  return;
}

Assistant:

void DataPipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime&) {

  visit_tuple([&](auto&& pipe){

    using data_pipe_t = std::decay_t<decltype(pipe)>;
    using callable_t  = typename data_pipe_t::callable_t;
    using input_t     = std::decay_t<typename data_pipe_t::input_t>;
    using output_t    = std::decay_t<typename data_pipe_t::output_t>;
    
    // first pipe
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      // [](tf::Pipeflow&) -> void {}, i.e., we only have one pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(pf);
      // [](tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(pf);
      }
    }
    // other pipes without pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, std::add_lvalue_reference_t<input_t> >) {
      // [](input_t&) -> void {}, i.e., the last pipe
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data));
      // [](input_t&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data)
        );
      }
    }
    // other pipes with pipeflow in the second argument
    else if constexpr (std::is_invocable_v<callable_t, input_t&, Pipeflow&>) {
      // [](input_t&, tf::Pipeflow&) -> void {}
      if constexpr (std::is_void_v<output_t>) {
        pipe._callable(std::get<input_t>(_buffer[pf._line].data), pf);
      // [](input_t&, tf::Pipeflow&) -> output_t {}
      } else {
        _buffer[pf._line].data = pipe._callable(
          std::get<input_t>(_buffer[pf._line].data), pf
        );
      }
    }
    //else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
    //  pipe._callable(pf, rt);
    //}
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}